

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool __thiscall ON_V4V5_MeshNgonUserData::CopyFrom(ON_V4V5_MeshNgonUserData *this,ON_Object *src)

{
  ON_V4V5_MeshNgonUserData *src_00;
  ON_V4V5_MeshNgonUserData *s;
  ON_Object *src_local;
  ON_V4V5_MeshNgonUserData *this_local;
  
  src_00 = Cast(src);
  if ((this == (ON_V4V5_MeshNgonUserData *)0x0) || (src_00 == (ON_V4V5_MeshNgonUserData *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    operator=(this,src_00);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

ON_V4V5_MeshNgonUserData::ON_V4V5_MeshNgonUserData()
{
  m_userdata_uuid = ON_CLASS_ID(ON_V4V5_MeshNgonUserData);
  m_application_uuid = ON_opennurbs4_id;
  m_userdata_copycount = 1;
  m_ngon_list = 0;
  m_mesh_F_count = 0;
  m_mesh_V_count = 0;
}